

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.cpp
# Opt level: O1

int __thiscall hmac_hash::SHA1::init(SHA1 *this,EVP_PKEY_CTX *ctx)

{
  pointer puVar1;
  
  this->m_h[0] = 0x67452301;
  this->m_h[1] = 0xefcdab89;
  this->m_h[2] = 0x98badcfe;
  this->m_h[3] = 0x10325476;
  this->m_h[4] = 0xc3d2e1f0;
  this->m_transforms = 0;
  puVar1 = (this->m_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->m_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  return (int)puVar1;
}

Assistant:

void SHA1::init() {
        // SHA1 initialization constants
        m_h[0] = 0x67452301;
        m_h[1] = 0xefcdab89;
        m_h[2] = 0x98badcfe;
        m_h[3] = 0x10325476;
        m_h[4] = 0xc3d2e1f0;
     
        // Reset counters
        m_transforms = 0;
        m_buffer.clear();
    }